

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

void xprint_paren(Parser *pp,PNode *p)

{
  uint32 *puVar1;
  PNode *pPVar2;
  int __c;
  PNode *pn;
  PNode *_t;
  PNode *pPVar3;
  ulong uVar4;
  char *pcVar5;
  
  do {
    pPVar3 = p->latest;
    pPVar2 = pPVar3->latest;
    pn = pPVar3;
    if (pPVar3 != pPVar3->latest) {
      do {
        pPVar3 = pPVar2;
        pPVar3->refcount = pPVar3->refcount + 1;
        puVar1 = &pn->refcount;
        *puVar1 = *puVar1 - 1;
        if (*puVar1 == 0) {
          free_PNode(pp,pn);
        }
        p->latest = pPVar3;
        pPVar2 = pPVar3->latest;
        pn = pPVar3;
      } while (pPVar3 != pPVar3->latest);
    }
    if (pPVar3->error_recovery != '\0') {
      return;
    }
    printf("[%p %s]",pPVar3,pp->t->symbols[(pPVar3->parse_node).symbol].name);
    if ((pPVar3->children).n == 0) {
      if ((pPVar3->parse_node).start_loc.s != (pPVar3->parse_node).end_skip) {
        __c = 0x20;
        putchar(0x20);
        for (pcVar5 = (pPVar3->parse_node).start_loc.s; pcVar5 < (pPVar3->parse_node).end_skip;
            pcVar5 = pcVar5 + 1) {
          putchar((int)*pcVar5);
        }
        goto LAB_00143905;
      }
    }
    else {
      putchar(0x28);
      __c = 0x29;
      if ((pPVar3->children).n != 0) {
        uVar4 = 0;
        do {
          xprint_paren(pp,(pPVar3->children).v[uVar4]);
          uVar4 = uVar4 + 1;
        } while (uVar4 < (pPVar3->children).n);
      }
LAB_00143905:
      putchar(__c);
    }
    if (pPVar3->ambiguities == (PNode *)0x0) {
      return;
    }
    printf(" |OR| ");
    p = pPVar3->ambiguities;
  } while( true );
}

Assistant:

void xprint_paren(Parser *pp, PNode *p) {
  uint i;
  char *c;
  LATEST(pp, p);
  if (!p->error_recovery) {
    printf("[%p %s]", (void *)p, pp->t->symbols[p->parse_node.symbol].name);
    if (p->children.n) {
      printf("(");
      for (i = 0; i < p->children.n; i++) xprint_paren(pp, p->children.v[i]);
      printf(")");
    } else if (p->parse_node.start_loc.s != p->parse_node.end_skip) {
      printf(" ");
      for (c = p->parse_node.start_loc.s; c < p->parse_node.end_skip; c++) printf("%c", *c);
      printf(" ");
    }
    if (p->ambiguities) {
      printf(" |OR| ");
      xprint_paren(pp, p->ambiguities);
    }
  }
}